

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

optional<cmLinkItem> * __thiscall
cmGeneratorTarget::LookupLinkItem
          (optional<cmLinkItem> *__return_storage_ptr__,cmGeneratorTarget *this,string *n,
          cmListFileBacktrace *bt,LookupLinkItemScope *scope,LookupSelf lookupSelf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string local_c0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0;
  cmLinkItem local_70;
  
  (__return_storage_ptr__->super__Optional_base<cmLinkItem,_false,_false>)._M_payload.
  super__Optional_payload<cmLinkItem,_true,_false,_false>.super__Optional_payload_base<cmLinkItem>.
  _M_engaged = false;
  bVar2 = IsLinkLookupScope(this,n,&scope->LG);
  if (!bVar2) {
    CheckCMP0004(&local_c0,this,n);
    if ((local_c0._M_string_length != 0) &&
       (((lookupSelf != No ||
         (psVar4 = cmTarget::GetName_abi_cxx11_(this->Target),
         local_c0._M_string_length != psVar4->_M_string_length)) ||
        ((local_c0._M_string_length != 0 &&
         (iVar3 = bcmp(local_c0._M_dataplus._M_p,(psVar4->_M_dataplus)._M_p,
                       local_c0._M_string_length), iVar3 != 0)))))) {
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + local_c0._M_string_length);
      local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      paVar1 = &local_a0.Value.field_2;
      if (local_e0 == &local_d0) {
        local_a0.Value.field_2._8_8_ = local_d0._8_8_;
        local_a0.Value._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a0.Value._M_dataplus._M_p = (pointer)local_e0;
      }
      local_a0.Value.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
      local_a0.Value.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
      local_a0.Value._M_string_length = local_d8;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_e0 = &local_d0;
      ResolveLinkItem(&local_70,this,&local_a0,scope->LG);
      std::optional<cmLinkItem>::operator=(__return_storage_ptr__,&local_70);
      if (local_70.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.String._M_dataplus._M_p != &local_70.String.field_2) {
        operator_delete(local_70.String._M_dataplus._M_p,
                        local_70.String.field_2._M_allocated_capacity + 1);
      }
      if (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.Value._M_dataplus._M_p,
                        local_a0.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,
                                          local_d0._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmLinkItem> cmGeneratorTarget::LookupLinkItem(
  std::string const& n, cmListFileBacktrace const& bt,
  LookupLinkItemScope* scope, LookupSelf lookupSelf) const
{
  cm::optional<cmLinkItem> maybeItem;
  if (this->IsLinkLookupScope(n, scope->LG)) {
    return maybeItem;
  }

  std::string name = this->CheckCMP0004(n);
  if (name.empty() ||
      (lookupSelf == LookupSelf::No && name == this->GetName())) {
    return maybeItem;
  }
  maybeItem = this->ResolveLinkItem(BT<std::string>(name, bt), scope->LG);
  return maybeItem;
}